

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O0

void ovf::detail::parse::v2::ovf_segment_header_action<ovf::detail::parse::v2::keyword_value_line>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *in,ovf_file *f,ovf_segment *segment)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  parse_error *ppVar4;
  char **in_RCX;
  code *args;
  char **args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  float fVar5;
  bool local_a2a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  allocator local_6f9;
  string local_6f8;
  undefined1 local_6d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  byte local_6ab;
  byte local_6aa;
  allocator local_6a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  allocator local_681;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  allocator local_659;
  string local_658;
  undefined1 local_631;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  allocator local_609;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  allocator local_5e1;
  string local_5e0;
  undefined1 local_5b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  allocator local_591;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  allocator local_569;
  string local_568;
  undefined1 local_541;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  allocator local_519;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  allocator local_4f1;
  string local_4f0;
  undefined1 local_4c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  allocator local_4a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  allocator local_479;
  string local_478;
  undefined1 local_451;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  allocator local_429;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  allocator local_401;
  string local_400;
  undefined1 local_3d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  allocator local_3b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  allocator local_389;
  string local_388;
  undefined1 local_361;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  allocator local_339;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  allocator local_311;
  string local_310;
  undefined1 local_2e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  allocator local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  allocator local_299;
  string local_298;
  undefined1 local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  allocator local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  allocator local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  allocator local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  char *local_188;
  char *local_180;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  undefined1 local_168 [8];
  string meshtype;
  string local_140;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  ovf_segment *local_20;
  ovf_segment *segment_local;
  ovf_file *f_local;
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_local;
  
  local_20 = segment;
  segment_local = (ovf_segment *)f;
  f_local = (ovf_file *)in;
  bVar1 = std::operator==(&f->_state->keyword,"title");
  if (bVar1) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pcVar3 = strdup(pcVar3);
    local_20->title = pcVar3;
    segment_local->valueunits[0x60] = '\x01';
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (segment_local->valueunits + 0x20),"desc");
    if (bVar1) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pcVar3 = strdup(pcVar3);
      local_20->comment = pcVar3;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (segment_local->valueunits + 0x20),"meshunit");
      if (bVar1) {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        pcVar3 = strdup(pcVar3);
        local_20->meshunit = pcVar3;
        segment_local->valueunits[0x61] = '\x01';
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(segment_local->valueunits + 0x20),"valuedim");
        if (bVar1) {
          pcVar3 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_40,pcVar3,&local_41);
          iVar2 = std::__cxx11::stoi(&local_40,(size_t *)0x0,10);
          local_20->valuedim = iVar2;
          std::__cxx11::string::~string((string *)&local_40);
          std::allocator<char>::~allocator((allocator<char> *)&local_41);
          segment_local->valueunits[0x62] = '\x01';
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(segment_local->valueunits + 0x20),"valueunits");
          if (bVar1) {
            pcVar3 = (char *)std::__cxx11::string::c_str();
            pcVar3 = strdup(pcVar3);
            local_20->valueunits = pcVar3;
            segment_local->valueunits[99] = '\x01';
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(segment_local->valueunits + 0x20),"valuelabels");
            if (bVar1) {
              pcVar3 = (char *)std::__cxx11::string::c_str();
              pcVar3 = strdup(pcVar3);
              local_20->valuelabels = pcVar3;
              segment_local->valueunits[100] = '\x01';
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(segment_local->valueunits + 0x20),"xmin");
              if (bVar1) {
                pcVar3 = (char *)std::__cxx11::string::c_str();
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_78,pcVar3,&local_79);
                fVar5 = std::__cxx11::stof(&local_78,(size_t *)0x0);
                local_20->bounds_min[0] = fVar5;
                std::__cxx11::string::~string((string *)&local_78);
                std::allocator<char>::~allocator((allocator<char> *)&local_79);
                segment_local->valueunits[0x65] = '\x01';
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(segment_local->valueunits + 0x20),"ymin");
                if (bVar1) {
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_a0,pcVar3,&local_a1);
                  fVar5 = std::__cxx11::stof(&local_a0,(size_t *)0x0);
                  local_20->bounds_min[1] = fVar5;
                  std::__cxx11::string::~string((string *)&local_a0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
                  segment_local->valueunits[0x66] = '\x01';
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(segment_local->valueunits + 0x20),"zmin");
                  if (bVar1) {
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_c8,pcVar3,&local_c9);
                    fVar5 = std::__cxx11::stof(&local_c8,(size_t *)0x0);
                    local_20->bounds_min[2] = fVar5;
                    std::__cxx11::string::~string((string *)&local_c8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
                    segment_local->valueunits[0x67] = '\x01';
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(segment_local->valueunits + 0x20),"xmax");
                    if (bVar1) {
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string((string *)&local_f0,pcVar3,&local_f1);
                      fVar5 = std::__cxx11::stof(&local_f0,(size_t *)0x0);
                      local_20->bounds_max[0] = fVar5;
                      std::__cxx11::string::~string((string *)&local_f0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
                      segment_local->valueunits[0x68] = '\x01';
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(segment_local->valueunits + 0x20),"ymax");
                      if (bVar1) {
                        pcVar3 = (char *)std::__cxx11::string::c_str();
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)&local_118,pcVar3,&local_119);
                        fVar5 = std::__cxx11::stof(&local_118,(size_t *)0x0);
                        local_20->bounds_max[1] = fVar5;
                        std::__cxx11::string::~string((string *)&local_118);
                        std::allocator<char>::~allocator((allocator<char> *)&local_119);
                        segment_local->valueunits[0x69] = '\x01';
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)(segment_local->valueunits + 0x20),"zmax");
                        if (bVar1) {
                          pcVar3 = (char *)std::__cxx11::string::c_str();
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)&local_140,pcVar3,
                                     (allocator *)(meshtype.field_2._M_local_buf + 0xf));
                          fVar5 = std::__cxx11::stof(&local_140,(size_t *)0x0);
                          local_20->bounds_max[2] = fVar5;
                          std::__cxx11::string::~string((string *)&local_140);
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(meshtype.field_2._M_local_buf + 0xf));
                          segment_local->valueunits[0x6a] = '\x01';
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(segment_local->valueunits + 0x20),"meshtype");
                          if (bVar1) {
                            std::__cxx11::string::string
                                      ((string *)local_168,
                                       (string *)(segment_local->valueunits + 0x40));
                            local_170._M_current = (char *)std::__cxx11::string::begin();
                            local_178._M_current = (char *)std::__cxx11::string::end();
                            local_180 = (char *)std::__cxx11::string::begin();
                            args = tolower;
                            local_188 = (char *)std::
                                                transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                                          (local_170,local_178,
                                                           (
                                                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  )local_180,tolower);
                            pcVar3 = local_20->meshtype;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string((string *)&local_1a8,pcVar3,&local_1a9);
                            bVar1 = std::operator==(&local_1a8,"");
                            std::__cxx11::string::~string((string *)&local_1a8);
                            std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
                            if (bVar1) {
                              bVar1 = std::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_168,"rectangular");
                              if ((bVar1) &&
                                 (bVar1 = std::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_168,"irregular"), bVar1)) {
                                local_1d1 = 1;
                                ppVar4 = (parse_error *)__cxa_allocate_exception(0x28);
                                fmt::v5::format<char[23],std::__cxx11::string>
                                          (&local_1d0,(v5 *)"Invalid meshtype: \"{}\"",
                                           (char (*) [23])local_168,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)args);
                                tao::pegtl::parse_error::
                                parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                          (ppVar4,&local_1d0,
                                           (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)f_local);
                                local_1d1 = 0;
                                __cxa_throw(ppVar4,&tao::pegtl::parse_error::typeinfo,
                                            tao::pegtl::parse_error::~parse_error);
                              }
                              pcVar3 = (char *)std::__cxx11::string::c_str();
                              pcVar3 = strdup(pcVar3);
                              local_20->meshtype = pcVar3;
                            }
                            else {
                              pcVar3 = local_20->meshtype;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string((string *)&local_1f8,pcVar3,&local_1f9);
                              bVar1 = std::operator!=(&local_1f8,
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_168);
                              std::__cxx11::string::~string((string *)&local_1f8);
                              std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
                              if (bVar1) {
                                local_221 = 1;
                                ppVar4 = (parse_error *)__cxa_allocate_exception(0x28);
                                fmt::v5::format<char[94],std::__cxx11::string,char*>
                                          (&local_220,
                                           (v5 *)
                                           "meshtype \"{}\" was specified, but due to other parameters specified before, \"{}\" was expected!"
                                           ,(char (*) [94])local_168,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_20->meshtype,(char **)in_R8);
                                tao::pegtl::parse_error::
                                parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                          (ppVar4,&local_220,
                                           (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)f_local);
                                local_221 = 0;
                                __cxa_throw(ppVar4,&tao::pegtl::parse_error::typeinfo,
                                            tao::pegtl::parse_error::~parse_error);
                              }
                            }
                            segment_local->valueunits[0x6b] = '\x01';
                            std::__cxx11::string::~string((string *)local_168);
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(segment_local->valueunits + 0x20),"xbase");
                            if (bVar1) {
                              pcVar3 = local_20->meshtype;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string((string *)&local_248,pcVar3,&local_249);
                              bVar1 = std::operator!=(&local_248,"rectangular");
                              std::__cxx11::string::~string((string *)&local_248);
                              std::allocator<char>::~allocator((allocator<char> *)&local_249);
                              if (bVar1) {
                                local_271 = 1;
                                ppVar4 = (parse_error *)__cxa_allocate_exception(0x28);
                                fmt::v5::format<char[56],char*>
                                          (&local_270,
                                           (v5 *)
                                           "xbase is only for rectangular meshes! Mesh type is \"{}\""
                                           ,(char (*) [56])&local_20->meshtype,in_RCX);
                                tao::pegtl::parse_error::
                                parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                          (ppVar4,&local_270,
                                           (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)f_local);
                                local_271 = 0;
                                __cxa_throw(ppVar4,&tao::pegtl::parse_error::typeinfo,
                                            tao::pegtl::parse_error::~parse_error);
                              }
                              pcVar3 = strdup("rectangular");
                              local_20->meshtype = pcVar3;
                              pcVar3 = (char *)std::__cxx11::string::c_str();
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string((string *)&local_298,pcVar3,&local_299);
                              fVar5 = std::__cxx11::stof(&local_298,(size_t *)0x0);
                              local_20->origin[0] = fVar5;
                              std::__cxx11::string::~string((string *)&local_298);
                              std::allocator<char>::~allocator((allocator<char> *)&local_299);
                              segment_local->valueunits[0x6c] = '\x01';
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(segment_local->valueunits + 0x20),"ybase");
                              if (bVar1) {
                                pcVar3 = local_20->meshtype;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string((string *)&local_2c0,pcVar3,&local_2c1)
                                ;
                                bVar1 = std::operator!=(&local_2c0,"rectangular");
                                std::__cxx11::string::~string((string *)&local_2c0);
                                std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
                                if (bVar1) {
                                  local_2e9 = 1;
                                  ppVar4 = (parse_error *)__cxa_allocate_exception(0x28);
                                  fmt::v5::format<char[56],char*>
                                            (&local_2e8,
                                             (v5 *)
                                             "ybase is only for rectangular meshes! Mesh type is \"{}\""
                                             ,(char (*) [56])&local_20->meshtype,in_RCX);
                                  tao::pegtl::parse_error::
                                  parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                            (ppVar4,&local_2e8,
                                             (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)f_local);
                                  local_2e9 = 0;
                                  __cxa_throw(ppVar4,&tao::pegtl::parse_error::typeinfo,
                                              tao::pegtl::parse_error::~parse_error);
                                }
                                pcVar3 = strdup("rectangular");
                                local_20->meshtype = pcVar3;
                                pcVar3 = (char *)std::__cxx11::string::c_str();
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string((string *)&local_310,pcVar3,&local_311)
                                ;
                                fVar5 = std::__cxx11::stof(&local_310,(size_t *)0x0);
                                local_20->origin[1] = fVar5;
                                std::__cxx11::string::~string((string *)&local_310);
                                std::allocator<char>::~allocator((allocator<char> *)&local_311);
                                segment_local->valueunits[0x6d] = '\x01';
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(segment_local->valueunits + 0x20),"zbase");
                                if (bVar1) {
                                  pcVar3 = local_20->meshtype;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)&local_338,pcVar3,&local_339);
                                  bVar1 = std::operator!=(&local_338,"rectangular");
                                  std::__cxx11::string::~string((string *)&local_338);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_339);
                                  if (bVar1) {
                                    local_361 = 1;
                                    ppVar4 = (parse_error *)__cxa_allocate_exception(0x28);
                                    fmt::v5::format<char[56],char*>
                                              (&local_360,
                                               (v5 *)
                                               "zbase is only for rectangular meshes! Mesh type is \"{}\""
                                               ,(char (*) [56])&local_20->meshtype,in_RCX);
                                    tao::pegtl::parse_error::
                                    parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                              (ppVar4,&local_360,
                                               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)f_local);
                                    local_361 = 0;
                                    __cxa_throw(ppVar4,&tao::pegtl::parse_error::typeinfo,
                                                tao::pegtl::parse_error::~parse_error);
                                  }
                                  pcVar3 = strdup("rectangular");
                                  local_20->meshtype = pcVar3;
                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)&local_388,pcVar3,&local_389);
                                  fVar5 = std::__cxx11::stof(&local_388,(size_t *)0x0);
                                  local_20->origin[2] = fVar5;
                                  std::__cxx11::string::~string((string *)&local_388);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_389);
                                  segment_local->valueunits[0x6e] = '\x01';
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(segment_local->valueunits + 0x20),"xstepsize");
                                  if (bVar1) {
                                    pcVar3 = local_20->meshtype;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)&local_3b0,pcVar3,&local_3b1);
                                    bVar1 = std::operator!=(&local_3b0,"rectangular");
                                    std::__cxx11::string::~string((string *)&local_3b0);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
                                    if (bVar1) {
                                      local_3d9 = 1;
                                      ppVar4 = (parse_error *)__cxa_allocate_exception(0x28);
                                      fmt::v5::format<char[60],char*>
                                                (&local_3d8,
                                                 (v5 *)
                                                 "xstepsize is only for rectangular meshes! Mesh type is \"{}\""
                                                 ,(char (*) [60])&local_20->meshtype,in_RCX);
                                      tao::pegtl::parse_error::
                                      parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                (ppVar4,&local_3d8,
                                                 (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)f_local);
                                      local_3d9 = 0;
                                      __cxa_throw(ppVar4,&tao::pegtl::parse_error::typeinfo,
                                                  tao::pegtl::parse_error::~parse_error);
                                    }
                                    pcVar3 = strdup("rectangular");
                                    local_20->meshtype = pcVar3;
                                    pcVar3 = (char *)std::__cxx11::string::c_str();
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)&local_400,pcVar3,&local_401);
                                    fVar5 = std::__cxx11::stof(&local_400,(size_t *)0x0);
                                    local_20->step_size[0] = fVar5;
                                    std::__cxx11::string::~string((string *)&local_400);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_401);
                                    segment_local->valueunits[0x6f] = '\x01';
                                  }
                                  else {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(segment_local->valueunits + 0x20),"ystepsize");
                                    if (bVar1) {
                                      pcVar3 = local_20->meshtype;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)&local_428,pcVar3,&local_429);
                                      bVar1 = std::operator!=(&local_428,"rectangular");
                                      std::__cxx11::string::~string((string *)&local_428);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_429);
                                      if (bVar1) {
                                        local_451 = 1;
                                        ppVar4 = (parse_error *)__cxa_allocate_exception(0x28);
                                        fmt::v5::format<char[60],char*>
                                                  (&local_450,
                                                   (v5 *)
                                                  "ystepsize is only for rectangular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [60])&local_20->meshtype,in_RCX);
                                        tao::pegtl::parse_error::
                                        parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                  (ppVar4,&local_450,
                                                   (
                                                  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)f_local);
                                        local_451 = 0;
                                        __cxa_throw(ppVar4,&tao::pegtl::parse_error::typeinfo,
                                                    tao::pegtl::parse_error::~parse_error);
                                      }
                                      pcVar3 = strdup("rectangular");
                                      local_20->meshtype = pcVar3;
                                      pcVar3 = (char *)std::__cxx11::string::c_str();
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)&local_478,pcVar3,&local_479);
                                      fVar5 = std::__cxx11::stof(&local_478,(size_t *)0x0);
                                      local_20->step_size[1] = fVar5;
                                      std::__cxx11::string::~string((string *)&local_478);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_479);
                                      segment_local->valueunits[0x70] = '\x01';
                                    }
                                    else {
                                      bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(segment_local->valueunits + 0x20),"zstepsize");
                                      if (bVar1) {
                                        pcVar3 = local_20->meshtype;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string
                                                  ((string *)&local_4a0,pcVar3,&local_4a1);
                                        bVar1 = std::operator!=(&local_4a0,"rectangular");
                                        std::__cxx11::string::~string((string *)&local_4a0);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)&local_4a1);
                                        if (bVar1) {
                                          local_4c9 = 1;
                                          ppVar4 = (parse_error *)__cxa_allocate_exception(0x28);
                                          fmt::v5::format<char[60],char*>
                                                    (&local_4c8,
                                                     (v5 *)
                                                  "zstepsize is only for rectangular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [60])&local_20->meshtype,in_RCX);
                                          tao::pegtl::parse_error::
                                          parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                    (ppVar4,&local_4c8,
                                                     (
                                                  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)f_local);
                                          local_4c9 = 0;
                                          __cxa_throw(ppVar4,&tao::pegtl::parse_error::typeinfo,
                                                      tao::pegtl::parse_error::~parse_error);
                                        }
                                        pcVar3 = strdup("rectangular");
                                        local_20->meshtype = pcVar3;
                                        pcVar3 = (char *)std::__cxx11::string::c_str();
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string
                                                  ((string *)&local_4f0,pcVar3,&local_4f1);
                                        fVar5 = std::__cxx11::stof(&local_4f0,(size_t *)0x0);
                                        local_20->step_size[2] = fVar5;
                                        std::__cxx11::string::~string((string *)&local_4f0);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)&local_4f1);
                                        segment_local->valueunits[0x71] = '\x01';
                                      }
                                      else {
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(segment_local->valueunits + 0x20),"xnodes");
                                        if (bVar1) {
                                          pcVar3 = local_20->meshtype;
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string
                                                    ((string *)&local_518,pcVar3,&local_519);
                                          bVar1 = std::operator!=(&local_518,"rectangular");
                                          std::__cxx11::string::~string((string *)&local_518);
                                          std::allocator<char>::~allocator
                                                    ((allocator<char> *)&local_519);
                                          if (bVar1) {
                                            local_541 = 1;
                                            ppVar4 = (parse_error *)__cxa_allocate_exception(0x28);
                                            fmt::v5::format<char[57],char*>
                                                      (&local_540,
                                                       (v5 *)
                                                  "xnodes is only for rectangular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [57])&local_20->meshtype,in_RCX);
                                            tao::pegtl::parse_error::
                                            parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                      (ppVar4,&local_540,
                                                       (
                                                  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)f_local);
                                            local_541 = 0;
                                            __cxa_throw(ppVar4,&tao::pegtl::parse_error::typeinfo,
                                                        tao::pegtl::parse_error::~parse_error);
                                          }
                                          pcVar3 = strdup("rectangular");
                                          local_20->meshtype = pcVar3;
                                          pcVar3 = (char *)std::__cxx11::string::c_str();
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string
                                                    ((string *)&local_568,pcVar3,&local_569);
                                          iVar2 = std::__cxx11::stoi(&local_568,(size_t *)0x0,10);
                                          local_20->n_cells[0] = iVar2;
                                          std::__cxx11::string::~string((string *)&local_568);
                                          std::allocator<char>::~allocator
                                                    ((allocator<char> *)&local_569);
                                          segment_local->valueunits[0x72] = '\x01';
                                        }
                                        else {
                                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(segment_local->valueunits + 0x20),"ynodes");
                                          if (bVar1) {
                                            pcVar3 = local_20->meshtype;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      ((string *)&local_590,pcVar3,&local_591);
                                            bVar1 = std::operator!=(&local_590,"rectangular");
                                            std::__cxx11::string::~string((string *)&local_590);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_591);
                                            if (bVar1) {
                                              local_5b9 = 1;
                                              ppVar4 = (parse_error *)__cxa_allocate_exception(0x28)
                                              ;
                                              fmt::v5::format<char[57],char*>
                                                        (&local_5b8,
                                                         (v5 *)
                                                  "ynodes is only for rectangular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [57])&local_20->meshtype,in_RCX);
                                              tao::pegtl::parse_error::
                                              parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                        (ppVar4,&local_5b8,
                                                         (
                                                  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)f_local);
                                              local_5b9 = 0;
                                              __cxa_throw(ppVar4,&tao::pegtl::parse_error::typeinfo,
                                                          tao::pegtl::parse_error::~parse_error);
                                            }
                                            pcVar3 = strdup("rectangular");
                                            local_20->meshtype = pcVar3;
                                            pcVar3 = (char *)std::__cxx11::string::c_str();
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      ((string *)&local_5e0,pcVar3,&local_5e1);
                                            iVar2 = std::__cxx11::stoi(&local_5e0,(size_t *)0x0,10);
                                            local_20->n_cells[1] = iVar2;
                                            std::__cxx11::string::~string((string *)&local_5e0);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_5e1);
                                            segment_local->valueunits[0x73] = '\x01';
                                          }
                                          else {
                                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(segment_local->valueunits + 0x20),"znodes");
                                            if (bVar1) {
                                              pcVar3 = local_20->meshtype;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string
                                                        ((string *)&local_608,pcVar3,&local_609);
                                              bVar1 = std::operator!=(&local_608,"rectangular");
                                              std::__cxx11::string::~string((string *)&local_608);
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)&local_609);
                                              if (bVar1) {
                                                local_631 = 1;
                                                ppVar4 = (parse_error *)
                                                         __cxa_allocate_exception(0x28);
                                                fmt::v5::format<char[57],char*>
                                                          (&local_630,
                                                           (v5 *)
                                                  "znodes is only for rectangular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [57])&local_20->meshtype,in_RCX);
                                                tao::pegtl::parse_error::
                                                parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                          (ppVar4,&local_630,
                                                           (
                                                  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)f_local);
                                                local_631 = 0;
                                                __cxa_throw(ppVar4,&tao::pegtl::parse_error::
                                                                    typeinfo,
                                                            tao::pegtl::parse_error::~parse_error);
                                              }
                                              pcVar3 = strdup("rectangular");
                                              local_20->meshtype = pcVar3;
                                              pcVar3 = (char *)std::__cxx11::string::c_str();
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string
                                                        ((string *)&local_658,pcVar3,&local_659);
                                              iVar2 = std::__cxx11::stoi(&local_658,(size_t *)0x0,10
                                                                        );
                                              local_20->n_cells[2] = iVar2;
                                              std::__cxx11::string::~string((string *)&local_658);
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)&local_659);
                                              segment_local->valueunits[0x74] = '\x01';
                                            }
                                            else {
                                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(segment_local->valueunits + 0x20),"pointcount")
                                              ;
                                              if (!bVar1) {
                                                ppVar4 = (parse_error *)
                                                         __cxa_allocate_exception(0x28);
                                                fmt::v5::
                                                format<char[27],std::__cxx11::string,std::__cxx11::string>
                                                          (&local_720,
                                                           (v5 *)"unknown keyword \"{}\": \"{}\"",
                                                           (char (*) [27])
                                                           (segment_local->valueunits + 0x20),
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(segment_local->valueunits + 0x40),in_R8);
                                                tao::pegtl::parse_error::
                                                parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                          (ppVar4,&local_720,
                                                           (
                                                  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)f_local);
                                                __cxa_throw(ppVar4,&tao::pegtl::parse_error::
                                                                    typeinfo,
                                                            tao::pegtl::parse_error::~parse_error);
                                              }
                                              pcVar3 = local_20->meshtype;
                                              std::allocator<char>::allocator();
                                              local_6aa = 0;
                                              local_6ab = 0;
                                              std::__cxx11::string::string
                                                        ((string *)&local_680,pcVar3,&local_681);
                                              bVar1 = std::operator!=(&local_680,"");
                                              args_00 = (char **)CONCAT71((int7)((ulong)in_RCX >> 8)
                                                                          ,bVar1);
                                              local_a2a = false;
                                              if (bVar1) {
                                                pcVar3 = local_20->meshtype;
                                                std::allocator<char>::allocator();
                                                local_6aa = 1;
                                                std::__cxx11::string::string
                                                          ((string *)&local_6a8,pcVar3,&local_6a9);
                                                local_6ab = 1;
                                                local_a2a = std::operator!=(&local_6a8,"irregular");
                                              }
                                              if ((local_6ab & 1) != 0) {
                                                std::__cxx11::string::~string((string *)&local_6a8);
                                              }
                                              if ((local_6aa & 1) != 0) {
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)&local_6a9);
                                              }
                                              std::__cxx11::string::~string((string *)&local_680);
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)&local_681);
                                              if (local_a2a != false) {
                                                local_6d1 = 1;
                                                ppVar4 = (parse_error *)
                                                         __cxa_allocate_exception(0x28);
                                                fmt::v5::format<char[59],char*>
                                                          (&local_6d0,
                                                           (v5 *)
                                                  "pointcount is only for irregular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [59])&local_20->meshtype,args_00);
                                                tao::pegtl::parse_error::
                                                parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                          (ppVar4,&local_6d0,
                                                           (
                                                  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)f_local);
                                                local_6d1 = 0;
                                                __cxa_throw(ppVar4,&tao::pegtl::parse_error::
                                                                    typeinfo,
                                                            tao::pegtl::parse_error::~parse_error);
                                              }
                                              pcVar3 = strdup("irregular");
                                              local_20->meshtype = pcVar3;
                                              pcVar3 = (char *)std::__cxx11::string::c_str();
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string
                                                        ((string *)&local_6f8,pcVar3,&local_6f9);
                                              iVar2 = std::__cxx11::stoi(&local_6f8,(size_t *)0x0,10
                                                                        );
                                              local_20->pointcount = iVar2;
                                              std::__cxx11::string::~string((string *)&local_6f8);
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)&local_6f9);
                                              segment_local->valueunits[0x75] = '\x01';
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::operator=((string *)(segment_local->valueunits + 0x20),"");
  std::__cxx11::string::operator=((string *)(segment_local->valueunits + 0x40),"");
  return;
}

Assistant:

static void apply( const Input& in, ovf_file & f, ovf_segment & segment )
            {
                if( f._state->keyword == "title" )
                {
                    segment.title = strdup(f._state->value.c_str());
                    f._state->found_title = true;
                }
                else if( f._state->keyword == "desc" )
                    segment.comment = strdup(f._state->value.c_str());
                else if( f._state->keyword == "meshunit" )
                {
                    segment.meshunit = strdup(f._state->value.c_str());
                    f._state->found_meshunit = true;
                }
                else if( f._state->keyword == "valuedim" )
                {
                    segment.valuedim = std::stoi(f._state->value.c_str());
                    f._state->found_valuedim = true;
                }
                else if( f._state->keyword == "valueunits" )
                {
                    segment.valueunits = strdup(f._state->value.c_str());
                    f._state->found_valueunits = true;
                }
                else if( f._state->keyword == "valuelabels" )
                {
                    segment.valuelabels = strdup(f._state->value.c_str());
                    f._state->found_valuelabels = true;
                }
                else if( f._state->keyword == "xmin" )
                {
                    segment.bounds_min[0] = std::stof(f._state->value.c_str());
                    f._state->found_xmin = true;
                }
                else if( f._state->keyword == "ymin" )
                {
                    segment.bounds_min[1] = std::stof(f._state->value.c_str());
                    f._state->found_ymin = true;
                }
                else if( f._state->keyword == "zmin" )
                {
                    segment.bounds_min[2] = std::stof(f._state->value.c_str());
                    f._state->found_zmin = true;
                }
                else if( f._state->keyword == "xmax" )
                {
                    segment.bounds_max[0] = std::stof(f._state->value.c_str());
                    f._state->found_xmax = true;
                }
                else if( f._state->keyword == "ymax" )
                {
                    segment.bounds_max[1] = std::stof(f._state->value.c_str());
                    f._state->found_ymax = true;
                }
                else if( f._state->keyword == "zmax" )
                {
                    segment.bounds_max[2] = std::stof(f._state->value.c_str());
                    f._state->found_zmax = true;
                }
                else if( f._state->keyword == "meshtype" )
                {
                    std::string meshtype = f._state->value;
                    std::transform(meshtype.begin(), meshtype.end(), meshtype.begin(), ::tolower);
                    if( std::string(segment.meshtype) == "" )
                    {
                        if( meshtype != "rectangular" && meshtype != "irregular" )
                            throw tao::pegtl::parse_error( fmt::format(
                                "Invalid meshtype: \"{}\"", meshtype), in );
                        segment.meshtype = strdup(meshtype.c_str());
                    }
                    else if( std::string(segment.meshtype) != meshtype )
                    {
                        throw tao::pegtl::parse_error( fmt::format(
                            "meshtype \"{}\" was specified, but due to other parameters specified before, \"{}\" was expected!",
                            meshtype, segment.meshtype), in );
                    }
                    f._state->found_meshtype = true;
                }
                else if( f._state->keyword == "xbase" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "xbase is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.origin[0] = std::stof(f._state->value.c_str());
                    f._state->found_xbase = true;
                }
                else if( f._state->keyword == "ybase" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "ybase is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.origin[1] = std::stof(f._state->value.c_str());
                    f._state->found_ybase = true;
                }
                else if( f._state->keyword == "zbase" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "zbase is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.origin[2] = std::stof(f._state->value.c_str());
                    f._state->found_zbase = true;
                }
                else if( f._state->keyword == "xstepsize" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "xstepsize is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.step_size[0] = std::stof(f._state->value.c_str());
                    f._state->found_xstepsize = true;
                }
                else if( f._state->keyword == "ystepsize" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "ystepsize is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.step_size[1] = std::stof(f._state->value.c_str());
                    f._state->found_ystepsize = true;
                }
                else if( f._state->keyword == "zstepsize" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "zstepsize is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.step_size[2] = std::stof(f._state->value.c_str());
                    f._state->found_zstepsize = true;
                }
                else if( f._state->keyword == "xnodes" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "xnodes is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.n_cells[0] = std::stoi(f._state->value.c_str());
                    f._state->found_xnodes = true;
                }
                else if( f._state->keyword == "ynodes" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "ynodes is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.n_cells[1] = std::stoi(f._state->value.c_str());
                    f._state->found_ynodes = true;
                }
                else if( f._state->keyword == "znodes" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "znodes is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.n_cells[2] = std::stoi(f._state->value.c_str());
                    f._state->found_znodes = true;
                }
                else if( f._state->keyword == "pointcount" )
                {
                    if( std::string(segment.meshtype) != "" && std::string(segment.meshtype) != "irregular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "pointcount is only for irregular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("irregular");
                    segment.pointcount = std::stoi(f._state->value.c_str());
                    f._state->found_pointcount = true;
                }
                else
                {
                    // UNKNOWN KEYWORD
                    throw tao::pegtl::parse_error( fmt::format(
                        "unknown keyword \"{}\": \"{}\"", f._state->keyword, f._state->value), in );
                }

                f._state->keyword = "";
                f._state->value = "";
            }